

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O2

Value * getOutput(Value *__return_storage_ptr__,string *str)

{
  istream *piVar1;
  Value *other;
  string s;
  string line;
  Value ans;
  Reader reader;
  ifstream fin;
  
  std::ifstream::ifstream(&fin,(string *)str,_S_in);
  Json::Value::Value(&ans,nullValue);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fin,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::append((string *)&s);
  }
  std::ifstream::close();
  Json::Reader::Reader(&reader);
  Json::Reader::parse(&reader,&s,&ans,true);
  other = Json::Value::operator[](&ans,"response");
  Json::Value::Value(__return_storage_ptr__,other);
  Json::Reader::~Reader(&reader);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&line);
  Json::Value::~Value(&ans);
  std::ifstream::~ifstream(&fin);
  return __return_storage_ptr__;
}

Assistant:

Json::Value getOutput(string str)
{
    ifstream fin(str);
    Json::Value ans;
    string line, s;
    while (getline(fin, line))
        s += line;
    fin.close();
    Json::Reader reader;
    reader.parse(s, ans);
    return ans["response"];
}